

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::DropNotNullInfo,duckdb::AlterEntryData,std::__cxx11::string_const&>
          (duckdb *this,AlterEntryData *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  DropNotNullInfo *this_00;
  string sStack_a8;
  AlterEntryData local_88;
  
  this_00 = (DropNotNullInfo *)operator_new(0x98);
  AlterEntryData::AlterEntryData(&local_88,args);
  ::std::__cxx11::string::string((string *)&sStack_a8,(string *)args_1);
  DropNotNullInfo::DropNotNullInfo(this_00,&local_88,&sStack_a8);
  *(DropNotNullInfo **)this = this_00;
  ::std::__cxx11::string::~string((string *)&sStack_a8);
  AlterEntryData::~AlterEntryData(&local_88);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}